

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O1

double bup(double *a,double *b,double *x,double *y,int *n,double *eps)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = *a;
  bup::apb = *b + dVar4;
  bup::ap1 = dVar4 + 1.0;
  bup::mu = 0;
  bup::d = 1.0;
  if (((*n != 1) && (1.0 <= dVar4)) && (bup::ap1 * 1.1 <= bup::apb)) {
    dVar4 = exparg(&bup::K1);
    bup::mu = (int)ABS(dVar4);
    dVar4 = exparg(&bup::K2);
    bup::k = (int)dVar4;
    if (bup::k < bup::mu) {
      bup::mu = bup::k;
    }
    bup::d = exp(-(double)bup::mu);
  }
  dVar4 = brcmp1(&bup::mu,a,b,x,y);
  dVar4 = dVar4 / *a;
  if (*n == 1) {
    return dVar4;
  }
  if ((dVar4 == 0.0) && (!NAN(dVar4))) {
    return dVar4;
  }
  iVar1 = *n + -1;
  bup::w = bup::d;
  bup::k = 0;
  if (1.0 < *b) {
    iVar3 = iVar1;
    if (0.0001 < *y) {
      dVar5 = ((*b + -1.0) * *x) / *y - *a;
      if (dVar5 < 1.0) goto LAB_00106ce5;
      if (dVar5 < (double)iVar1) {
        iVar3 = (int)dVar5;
      }
    }
    bup::k = iVar3;
    dVar5 = bup::d;
    if (bup::k < 1) {
      bup::i = 1;
    }
    else {
      bup::i = bup::k + 1;
      iVar3 = 0;
      do {
        dVar5 = dVar5 * ((bup::apb + (double)iVar3) / ((double)iVar3 + bup::ap1)) * *x;
        bup::d = bup::d + dVar5;
        iVar3 = iVar3 + 1;
        bup::w = bup::d;
      } while (bup::k != iVar3);
    }
    bup::d = dVar5;
    if (bup::k == iVar1) goto LAB_00106d67;
  }
LAB_00106ce5:
  piVar2 = &bup::k;
  do {
    iVar3 = *piVar2;
    bup::i = iVar3 + 1;
    if (iVar1 <= iVar3) break;
    bup::d = bup::d * ((bup::apb + (double)iVar3) / ((double)iVar3 + bup::ap1)) * *x;
    bup::w = bup::w + bup::d;
    piVar2 = &bup::i;
  } while (*eps * bup::w < bup::d);
LAB_00106d67:
  return dVar4 * bup::w;
}

Assistant:

double bup(double *a,double *b,double *x,double *y,int *n,double *eps)
/*
-----------------------------------------------------------------------
     EVALUATION OF IX(A,B) - IX(A+N,B) WHERE N IS A POSITIVE INTEGER.
     EPS IS THE TOLERANCE USED.
-----------------------------------------------------------------------
*/
{
static int K1 = 1;
static int K2 = 0;
static double bup,ap1,apb,d,l,r,t,w;
static int i,k,kp1,mu,nm1;
/*
     ..
     .. Executable Statements ..
*/
/*
          OBTAIN THE SCALING FACTOR EXP(-MU) AND
             EXP(MU)*(X**A*Y**B/BETA(A,B))/A
*/
    apb = *a+*b;
    ap1 = *a+1.0e0;
    mu = 0;
    d = 1.0e0;
    if(*n == 1 || *a < 1.0e0) goto S10;
    if(apb < 1.1e0*ap1) goto S10;
    mu = fabs(exparg(&K1));
    k = exparg(&K2);
    if(k < mu) mu = k;
    t = mu;
    d = exp(-t);
S10:
    bup = brcmp1(&mu,a,b,x,y)/ *a;
    if(*n == 1 || bup == 0.0e0) return bup;
    nm1 = *n-1;
    w = d;
/*
          LET K BE THE INDEX OF THE MAXIMUM TERM
*/
    k = 0;
    if(*b <= 1.0e0) goto S50;
    if(*y > 1.e-4) goto S20;
    k = nm1;
    goto S30;
S20:
    r = (*b-1.0e0)**x/ *y-*a;
    if(r < 1.0e0) goto S50;
    k = t = nm1;
    if(r < t) k = r;
S30:
/*
          ADD THE INCREASING TERMS OF THE SERIES
*/
    for(i=1; i<=k; i++) {
        l = i-1;
        d = (apb+l)/(ap1+l)**x*d;
        w += d;
    }
    if(k == nm1) goto S70;
S50:
/*
          ADD THE REMAINING TERMS OF THE SERIES
*/
    kp1 = k+1;
    for(i=kp1; i<=nm1; i++) {
        l = i-1;
        d = (apb+l)/(ap1+l)**x*d;
        w += d;
        if(d <= *eps*w) goto S70;
    }
S70:
/*
               TERMINATE THE PROCEDURE
*/
    bup *= w;
    return bup;
}